

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpargrid.cpp
# Opt level: O0

void __thiscall
TPZGenPartialGrid::TPZGenPartialGrid
          (TPZGenPartialGrid *this,TPZVec<int> *nx,TPZVec<int> *rangex,TPZVec<int> *rangey,
          TPZVec<double> *x0,TPZVec<double> *x1)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  int *piVar5;
  TPZVec<int> *this_00;
  TPZVec<int> *copy;
  TPZVec<int> *in_RSI;
  long in_RDI;
  TPZVec<double> *in_R8;
  TPZVec<double> *in_R9;
  int64_t in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  TPZVec<double> *in_stack_ffffffffffffff08;
  TPZVec<double> *in_stack_ffffffffffffff10;
  
  TPZVec<int>::TPZVec((TPZVec<int> *)in_stack_ffffffffffffff10,
                      (TPZVec<int> *)in_stack_ffffffffffffff08);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x20));
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x40));
  TPZVec<double>::TPZVec(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  TPZVec<double>::TPZVec(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  TPZVec<double>::TPZVec
            ((TPZVec<double> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  pdVar4 = TPZVec<double>::operator[](in_R9,0);
  dVar1 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](in_R8,0);
  dVar2 = *pdVar4;
  piVar5 = TPZVec<int>::operator[](in_RSI,0);
  iVar3 = *piVar5;
  pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xa0),0);
  *pdVar4 = (dVar1 - dVar2) / (double)iVar3;
  pdVar4 = TPZVec<double>::operator[](in_R9,1);
  dVar1 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](in_R8,1);
  dVar2 = *pdVar4;
  piVar5 = TPZVec<int>::operator[](in_RSI,1);
  iVar3 = *piVar5;
  pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xa0),1);
  *pdVar4 = (dVar1 - dVar2) / (double)iVar3;
  this_00 = (TPZVec<int> *)TPZVec<int>::operator[](in_RSI,0);
  iVar3 = *(int *)&this_00->_vptr_TPZVec + 1;
  copy = (TPZVec<int> *)TPZVec<int>::operator[](in_RSI,1);
  *(long *)(in_RDI + 0xc0) = (long)(iVar3 * (*(int *)&copy->_vptr_TPZVec + 1));
  *(undefined4 *)(in_RDI + 200) = 0;
  TPZVec<int>::operator=(this_00,copy);
  TPZVec<int>::operator=(this_00,copy);
  return;
}

Assistant:

TPZGenPartialGrid::TPZGenPartialGrid(TPZVec<int> &nx, TPZVec<int> &rangex, TPZVec<int> &rangey, TPZVec<REAL> &x0,TPZVec<REAL> &x1) : fNx(nx), fX0(x0), fX1(x1),
fDelx(2)
{
	fDelx[0] = (x1[0]-x0[0])/(nx[0]);
	fDelx[1] = (x1[1]-x0[1])/(nx[1]);
	fNumNodes= (nx[0]+1)*(nx[1]+1);
	fElementType = 0;
	fRangex = rangex;
	fRangey = rangey;
}